

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O3

MultiFab * __thiscall NavierStokesBase::get_rho_half_time(NavierStokesBase *this)

{
  MultiFab *this_00;
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  MFIter mfi;
  Box local_16c;
  Array4<double> local_150;
  Array4<double> local_110;
  Array4<double> local_d0;
  MFIter local_90;
  
  this_00 = &this->rho_half;
  amrex::MFIter::MFIter(&local_90,(FabArrayBase *)this_00,true);
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      amrex::MFIter::growntilebox(&local_16c,&local_90,-1000000);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_d0,&this_00->super_FabArray<amrex::FArrayBox>,&local_90);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_110,&(this->rho_ptime).super_FabArray<amrex::FArrayBox>,&local_90);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_150,&(this->rho_ctime).super_FabArray<amrex::FArrayBox>,&local_90);
      if (local_16c.smallend.vect[2] <= local_16c.bigend.vect[2]) {
        lVar6 = (long)local_16c.smallend.vect[1];
        lVar8 = (long)local_16c.smallend.vect[0];
        iVar2 = local_16c.smallend.vect[2];
        do {
          if (local_16c.smallend.vect[1] <= local_16c.bigend.vect[1]) {
            lVar3 = (long)iVar2;
            lVar7 = (long)local_d0.p +
                    (lVar3 - local_d0.begin.z) * local_d0.kstride * 8 +
                    (lVar6 - local_d0.begin.y) * local_d0.jstride * 8 + lVar8 * 8 +
                    (long)local_d0.begin.x * -8;
            lVar5 = (long)local_150.p +
                    (lVar3 - local_150.begin.z) * local_150.kstride * 8 +
                    (lVar6 - local_150.begin.y) * local_150.jstride * 8 + lVar8 * 8 +
                    (long)local_150.begin.x * -8;
            lVar4 = (long)local_110.p +
                    (lVar3 - local_110.begin.z) * local_110.kstride * 8 +
                    (lVar6 - local_110.begin.y) * local_110.jstride * 8 + lVar8 * 8 +
                    (long)local_110.begin.x * -8;
            lVar3 = lVar6;
            do {
              if (local_16c.smallend.vect[0] <= local_16c.bigend.vect[0]) {
                lVar1 = 0;
                do {
                  *(double *)(lVar7 + lVar1 * 8) =
                       (*(double *)(lVar4 + lVar1 * 8) + *(double *)(lVar5 + lVar1 * 8)) * 0.5;
                  lVar1 = lVar1 + 1;
                } while ((local_16c.bigend.vect[0] - local_16c.smallend.vect[0]) + 1 != (int)lVar1);
              }
              lVar3 = lVar3 + 1;
              lVar7 = lVar7 + local_d0.jstride * 8;
              lVar5 = lVar5 + local_150.jstride * 8;
              lVar4 = lVar4 + local_110.jstride * 8;
            } while (local_16c.bigend.vect[1] + 1 != (int)lVar3);
          }
          bVar9 = iVar2 != local_16c.bigend.vect[2];
          iVar2 = iVar2 + 1;
        } while (bVar9);
      }
      amrex::MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  amrex::MFIter::~MFIter(&local_90);
  return this_00;
}

Assistant:

MultiFab&
NavierStokesBase::get_rho_half_time ()
{
    //
    // Fill it in when needed ...
    //
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(rho_half,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.growntilebox();
        auto const& rho_h = rho_half.array(mfi);
        auto const& rho_p = rho_ptime.array(mfi);
        auto const& rho_c = rho_ctime.array(mfi);
        amrex::ParallelFor(bx, [rho_h, rho_p, rho_c]
        AMREX_GPU_DEVICE(int i, int j, int k) noexcept
        {
           rho_h(i,j,k) = 0.5 * (rho_p(i,j,k) + rho_c(i,j,k));
        });
    }
    return rho_half;
}